

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fMultisampleTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::MultisampleCase::renderTriangle
          (MultisampleCase *this,Vec2 *p0,Vec2 *p1,Vec2 *p2,Vec4 *c0,Vec4 *c1,Vec4 *c2)

{
  Vec3 local_30;
  Vec3 local_20;
  Vec3 local_10;
  
  local_10.m_data._0_8_ = *(undefined8 *)p0->m_data;
  local_10.m_data[2] = 0.0;
  local_20.m_data._0_8_ = *(undefined8 *)p1->m_data;
  local_20.m_data[2] = 0.0;
  local_30.m_data._0_8_ = *(undefined8 *)p2->m_data;
  local_30.m_data[2] = 0.0;
  renderTriangle(this,&local_10,&local_20,&local_30,c0,c1,c2);
  return;
}

Assistant:

void MultisampleCase::renderTriangle (const Vec2& p0, const Vec2& p1, const Vec2& p2, const Vec4& c0, const Vec4& c1, const Vec4& c2) const
{
	renderTriangle(Vec3(p0.x(), p0.y(), 0.0f),
				   Vec3(p1.x(), p1.y(), 0.0f),
				   Vec3(p2.x(), p2.y(), 0.0f),
				   c0, c1, c2);
}